

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crunch.cpp
# Opt level: O1

bool __thiscall crunch::convert(crunch *this,char *pCommand_line)

{
  command_line_params *pcVar1;
  crunch *this_00;
  bool bVar2;
  uint uVar3;
  pixel_format fmt;
  int iVar4;
  char *pcVar5;
  _Rb_tree_node_base *p_Var6;
  console *this_01;
  _Rb_tree_node_base *p_Var7;
  long lVar8;
  uint32 i;
  uint index;
  ulong uVar9;
  vector<crnlib::command_line_params::param_desc> params;
  dynamic_string log_filename;
  param_desc std_params [64];
  vector<crnlib::command_line_params::param_desc> local_468;
  crunch *local_458;
  command_line_params *local_450;
  dynamic_string local_448;
  param_desc local_438 [64];
  
  this->m_num_processed = 0;
  this->m_num_failed = 0;
  this->m_num_succeeded = 0;
  this->m_num_skipped = 0;
  memcpy(local_438,&DAT_001cdfc0,0x400);
  local_468.m_p = (param_desc *)0x0;
  local_468.m_size = 0;
  local_468.m_capacity = 0;
  crnlib::vector<crnlib::command_line_params::param_desc>::append(&local_468,local_438,0x40);
  for (index = 0; uVar3 = crnlib::pixel_format_helpers::get_num_formats(), index < uVar3;
      index = index + 1) {
    fmt = crnlib::pixel_format_helpers::get_pixel_format_by_index(index);
    pcVar5 = crnlib::pixel_format_helpers::get_pixel_format_string(fmt);
    if (local_468.m_capacity <= local_468.m_size) {
      crnlib::elemental_vector::increase_capacity
                ((elemental_vector *)&local_468,local_468.m_size + 1,true,0x10,(object_mover)0x0,
                 false);
    }
    uVar9 = (ulong)local_468.m_size;
    local_468.m_p[uVar9].m_pName = pcVar5;
    local_468.m_p[uVar9].m_num_values = 0;
    local_468.m_p[uVar9].m_support_listing_file = false;
    local_468.m_size = local_468.m_size + 1;
  }
  local_450 = &this->m_params;
  bVar2 = crnlib::command_line_params::parse
                    (local_450,pCommand_line,local_468.m_size,local_468.m_p,true);
  if (bVar2) {
    if ((int)(this->m_params).m_param_map._M_t._M_impl.super__Rb_tree_header._M_node_count != 0) {
      bVar2 = crnlib::command_line_params::get_value_as_bool(local_450,"debug",0,false);
      local_458 = this;
      if (bVar2) {
        pcVar5 = "Command line parameters:";
        crnlib::console::debug("Command line parameters:");
        pcVar1 = &local_458->m_params;
        p_Var6 = (local_458->m_params).m_param_map._M_t._M_impl.super__Rb_tree_header._M_header.
                 _M_left;
        while (p_Var7 = p_Var6,
              (_Rb_tree_header *)p_Var7 != &(pcVar1->m_param_map)._M_t._M_impl.super__Rb_tree_header
              ) {
          crnlib::console::disable_crlf((console *)pcVar5);
          pcVar5 = (char *)p_Var7[1]._M_parent;
          if ((_Base_ptr)pcVar5 == (_Base_ptr)0x0) {
            pcVar5 = "";
          }
          crnlib::console::debug
                    ("Key:\"%s\" Values (%u): ",pcVar5,(ulong)*(uint *)&p_Var7[1]._M_right);
          if (*(int *)&p_Var7[1]._M_right != 0) {
            lVar8 = 8;
            uVar9 = 0;
            do {
              pcVar5 = *(char **)((long)&(p_Var7[1]._M_left)->_M_color + lVar8);
              if (pcVar5 == (char *)0x0) {
                pcVar5 = "";
              }
              crnlib::console::debug("\"%s\" ",pcVar5);
              uVar9 = uVar9 + 1;
              lVar8 = lVar8 + 0x10;
            } while (uVar9 < *(uint *)&p_Var7[1]._M_right);
          }
          this_01 = (console *)0x1a575b;
          crnlib::console::debug("\n");
          crnlib::console::enable_crlf(this_01);
          p_Var6 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var7);
          pcVar5 = (char *)p_Var7;
        }
      }
      local_448.m_buf_size = 0;
      local_448.m_len = 0;
      local_448.m_pStr = (char *)0x0;
      iVar4 = 0x1a4b2c;
      bVar2 = crnlib::command_line_params::get_value_as_string(local_450,"logfile",0,&local_448,0);
      this_00 = local_458;
      if (bVar2) {
        pcVar5 = local_448.m_pStr;
        if (local_448.m_pStr == (char *)0x0) {
          pcVar5 = "";
        }
        iVar4 = crnlib::cfile_stream::open(&local_458->m_log_stream,pcVar5,6,1);
        pcVar5 = "";
        if (local_448.m_pStr != (char *)0x0) {
          pcVar5 = local_448.m_pStr;
        }
        if ((char)iVar4 != '\0') {
          crnlib::console::printf("Appending output to log file \"%s\"");
          iVar4 = (int)pcVar5;
          crnlib::console::m_pLog_stream = this_00;
          goto LAB_00109737;
        }
        bVar2 = false;
        crnlib::console::error("Unable to open log file: \"%s\"",pcVar5);
      }
      else {
LAB_00109737:
        bVar2 = convert(this_00);
        if (((this_00->m_log_stream).super_data_stream.field_0x1a & 1) != 0) {
          crnlib::console::m_pLog_stream = (crunch *)0x0;
          crnlib::cfile_stream::close(&this_00->m_log_stream,iVar4);
        }
      }
      if ((local_448.m_pStr != (char *)0x0) &&
         ((*(uint *)(local_448.m_pStr + -8) ^ *(uint *)(local_448.m_pStr + -4)) == 0xffffffff)) {
        crnlib::crnlib_free(local_448.m_pStr + -0x10);
      }
      goto LAB_00109774;
    }
    crnlib::console::error("No command line parameters specified!");
    print_usage();
  }
  bVar2 = false;
LAB_00109774:
  if (local_468.m_p != (param_desc *)0x0) {
    crnlib::crnlib_free(local_468.m_p);
  }
  return bVar2;
}

Assistant:

bool convert(const char* pCommand_line)
    {
        m_num_processed = 0;
        m_num_failed = 0;
        m_num_succeeded = 0;
        m_num_skipped = 0;

        command_line_params::param_desc std_params[] =
        {
            { "file", 1, true },

            { "out", 1, false },
            { "outdir", 1, false },
            { "outsamedir", 0, false },
            { "deep", 0, false },
            { "fileformat", 1, false },

            { "helperThreads", 1, false },
            { "noprogress", 0, false },
            { "quiet", 0, false },
            { "ignoreerrors", 0, false },
            { "logfile", 1, false },

            { "q", 1, false },
            { "quality", 1, false },

            { "c", 1, false },
            { "s", 1, false },
            { "ca", 1, false },
            { "sa", 1, false },

            { "mipMode", 1, false },
            { "mipFilter", 1, false },
            { "gamma", 1, false },
            { "blurriness", 1, false },
            { "wrap", 0, false },
            { "renormalize", 0, false },
            { "rtopmip", 0, false },
            { "noprogress", 0, false },
            { "paramdebug", 0, false },
            { "debug", 0, false },
            { "quick", 0, false },
            { "imagestats", 0, false },
            { "nostats", 0, false },
            { "mipstats", 0, false },

            { "alphaThreshold", 1, false },
            { "uniformMetrics", 0, false },
            { "noAdaptiveBlocks", 0, false },
            { "compressor", 1, false },
            { "dxtQuality", 1, false },
            { "noendpointcaching", 0, false },
            { "grayscalesampling", 0, false },
            { "converttoluma", 0, false },
            { "setalphatoluma", 0, false },
            { "pause", 0, false },
            { "timestamp", 0, false },
            { "nooverwrite", 0, false },
            { "forcewrite", 0, false },
            { "recreate", 0, false },
            { "compare", 0, false },
            { "info", 0, false },
            { "forceprimaryencoding", 0, false },
            { "usetransparentindicesforblack", 0, false },
            { "usesourceformat", 0, false },

            { "rescalemode", 1, false },
            { "rescale", 2, false },
            { "relrescale", 2, false },
            { "clamp", 2, false },
            { "clampScale", 2, false },
            { "window", 4, false },

            { "maxmips", 1, false },
            { "minmipsize", 1, false },

            { "bitrate", 1, false },

            { "lzmastats", 0, false },
            { "split", 0, false },
            { "csvfile", 1, false },

            { "yflip", 0, false },
            { "unflip", 0, false },
        };

        crnlib::vector<command_line_params::param_desc> params;
        params.append(std_params, sizeof(std_params) / sizeof(std_params[0]));

        for (uint32 i = 0; i < pixel_format_helpers::get_num_formats(); i++)
        {
            pixel_format fmt = pixel_format_helpers::get_pixel_format_by_index(i);

            command_line_params::param_desc desc;
            desc.m_pName = pixel_format_helpers::get_pixel_format_string(fmt);
            desc.m_num_values = 0;
            desc.m_support_listing_file = false;
            params.push_back(desc);
        }

        if (!m_params.parse(pCommand_line, params.size(), params.get_ptr(), true))
        {
            return false;
        }

        if (!m_params.get_num_params())
        {
            console::error("No command line parameters specified!");

            print_usage();

            return false;
        }

#if 0
        if (m_params.get_count(""))
        {
            console::error("Unrecognized command line parameter: \"%s\"", m_params.get_value_as_string_or_empty("", 0).get_ptr());

            return false;
        }
#endif

        if (m_params.get_value_as_bool("debug"))
        {
            console::debug("Command line parameters:");
            for (command_line_params::param_map_const_iterator it = m_params.begin(); it != m_params.end(); ++it)
            {
                console::disable_crlf();
                console::debug("Key:\"%s\" Values (%u): ", it->first.get_ptr(), it->second.m_values.size());
                for (uint32 i = 0; i < it->second.m_values.size(); i++)
                {
                    console::debug("\"%s\" ", it->second.m_values[i].get_ptr());
                }
                console::debug("\n");
                console::enable_crlf();
            }
        }

        dynamic_string log_filename;
        if (m_params.get_value_as_string("logfile", 0, log_filename))
        {
            if (!m_log_stream.open(log_filename.get_ptr(), cDataStreamWritable | cDataStreamSeekable, true))
            {
                console::error("Unable to open log file: \"%s\"", log_filename.get_ptr());
                return false;
            }

            console::printf("Appending output to log file \"%s\"", log_filename.get_ptr());

            console::set_log_stream(&m_log_stream);
        }

        bool status = convert();

        if (m_log_stream.is_opened())
        {
            console::set_log_stream(nullptr);

            m_log_stream.close();
        }

        return status;
    }